

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimplifyLocals.cpp
# Opt level: O2

void wasm::SimplifyLocals<true,_true,_true>::doNoteIfFalse
               (SimplifyLocals<true,_true,_true> *self,Expression **currp)

{
  If *iff;
  
  iff = Expression::cast<wasm::If>(*currp);
  if (iff->ifFalse != (Expression *)0x0) {
    optimizeIfElseReturn
              (self,iff,currp,
               (self->ifStack).
               super__Vector_base<std::map<unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>_>,_std::allocator<std::map<unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1);
    std::
    vector<std::map<unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>_>,_std::allocator<std::map<unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>_>_>_>
    ::pop_back(&self->ifStack);
    std::
    _Rb_tree<unsigned_int,_std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>,_std::_Select1st<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_wasm::SimplifyLocals<true,_true,_true>::SinkableInfo>_>_>
    ::clear(&(self->sinkables)._M_t);
    return;
  }
  __assert_fail("iff->ifFalse",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/passes/SimplifyLocals.cpp"
                ,0xbd,
                "static void wasm::SimplifyLocals<>::doNoteIfFalse(SimplifyLocals<allowTee, allowStructure, allowNesting> *, Expression **) [allowTee = true, allowStructure = true, allowNesting = true]"
               );
}

Assistant:

static void
  doNoteIfFalse(SimplifyLocals<allowTee, allowStructure, allowNesting>* self,
                Expression** currp) {
    // we processed the ifFalse side of this if-else, we can now try to
    // mere with the ifTrue side and optimize a return value, if possible
    auto* iff = (*currp)->cast<If>();
    assert(iff->ifFalse);
    if (allowStructure) {
      self->optimizeIfElseReturn(iff, currp, self->ifStack.back());
    }
    self->ifStack.pop_back();
    self->sinkables.clear();
  }